

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sStressTests.cpp
# Opt level: O1

int __thiscall deqp::gles3::Stress::StressTests::init(StressTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  MemoryTests::MemoryTests((MemoryTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  OcclusionQueryTests::OcclusionQueryTests
            ((OcclusionQueryTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  SyncTests::SyncTests((SyncTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  LongRunningTests::LongRunningTests
            ((LongRunningTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  SpecialFloatTests::SpecialFloatTests
            ((SpecialFloatTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  DrawTests::DrawTests((DrawTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  VertexArrayTests::VertexArrayTests
            ((VertexArrayTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  LongShaderTests::LongShaderTests((LongShaderTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  LongRunningShaderTests::LongRunningShaderTests
            ((LongRunningShaderTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void StressTests::init (void)
{
	addChild(new MemoryTests			(m_context));
	addChild(new OcclusionQueryTests	(m_context));
	addChild(new SyncTests				(m_context));
	addChild(new LongRunningTests		(m_context));
	addChild(new SpecialFloatTests		(m_context));
	addChild(new DrawTests				(m_context));
	addChild(new VertexArrayTests		(m_context));
	addChild(new LongShaderTests		(m_context));
	addChild(new LongRunningShaderTests	(m_context));
}